

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O0

int32 __thiscall
LowererMDArch::LowerCallArgs
          (LowererMDArch *this,Instr *callInstr,ushort callFlags,ArgSlot extraParams,
          IntConstOpnd **callInfoOpndRef)

{
  code *pcVar1;
  Instr *callInstr_00;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  SymOpnd *pSVar5;
  StackSym *this_00;
  JITTimeFunctionBody *pJVar6;
  Opnd *pOVar7;
  uint *puVar8;
  Instr *insertBeforeInstrForCFGCheck;
  Opnd *functionObjOpnd;
  IntConstOpnd *pIStack_88;
  uint32 argSlots;
  IntConstOpnd *argCountOpnd;
  Instr *startCallInstr;
  StackSym *argLinkSym;
  RegOpnd *argLinkOpnd;
  Opnd *dstOpnd;
  ArgSlot index;
  StackSym *pSStack_58;
  ArgSlot argPosition;
  StackSym *argLinkSym_1;
  SymOpnd *argLinkOpnd_1;
  Opnd *src2;
  Instr *cfgInsertLoc;
  Instr *argInstr;
  uint32 argCount;
  ArgSlot argOffset;
  IntConstOpnd **callInfoOpndRef_local;
  ArgSlot extraParams_local;
  Instr *pIStack_18;
  ushort callFlags_local;
  Instr *callInstr_local;
  LowererMDArch *this_local;
  
  _argCount = callInfoOpndRef;
  callInfoOpndRef_local._4_2_ = extraParams;
  callInfoOpndRef_local._6_2_ = callFlags;
  pIStack_18 = callInstr;
  callInstr_local = (Instr *)this;
  if (this->helperCallArgsCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x1cb,"(this->helperCallArgsCount == 0)",
                       "We don\'t support nested helper calls yet");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  argInstr._6_2_ = 1;
  argInstr._0_4_ = 0;
  cfgInsertLoc = pIStack_18;
  src2 = (Opnd *)IR::Instr::GetPrevRealInstr(pIStack_18);
  argLinkOpnd_1 = (SymOpnd *)IR::Instr::UnlinkSrc2(cfgInsertLoc);
  while( true ) {
    bVar2 = IR::Opnd::IsSymOpnd(&argLinkOpnd_1->super_Opnd);
    if (!bVar2) {
      argLinkSym = (StackSym *)IR::Opnd::AsRegOpnd(&argLinkOpnd_1->super_Opnd);
      startCallInstr =
           (Instr *)Sym::AsStackSym(&(*(StackSym **)&(argLinkSym->super_Sym).m_id)->super_Sym);
      bVar2 = StackSym::IsArgSlotSym((StackSym *)startCallInstr);
      if ((bVar2) || (((ulong)startCallInstr->m_prev & 1) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                           ,0x205,"(!argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef)",
                           "Arg tree not single def...");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      argCountOpnd = (IntConstOpnd *)startCallInstr->globOptInstrString;
      if ((((pIStack_18->m_opcode == NewScObject) || (pIStack_18->m_opcode == NewScObjectSpread)) ||
          (pIStack_18->m_opcode == NewScObjectLiteral)) ||
         ((pIStack_18->m_opcode == NewScObjArray || (pIStack_18->m_opcode == NewScObjArraySpread))))
      {
        argInstr._0_4_ = (uint)argInstr + 1;
      }
      if ((*(short *)&argCountOpnd[1].super_Opnd._vptr_Opnd != 7) &&
         (*(short *)&argCountOpnd[1].super_Opnd._vptr_Opnd != 0x18a)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                           ,0x215,
                           "(startCallInstr->m_opcode == Js::OpCode::StartCall || startCallInstr->m_opcode == Js::OpCode::LoweredStartCall)"
                           ,"Problem with arg chain.");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      uVar3 = IR::Instr::GetArgOutCount((Instr *)argCountOpnd,false);
      if (uVar3 != (uint)argInstr) {
        pJVar6 = Func::GetJITFunctionBody(this->m_func);
        bVar2 = JITTimeFunctionBody::IsAsmJsMode(pJVar6);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                             ,0x218,
                             "(startCallInstr->GetArgOutCount( false) == argCount || m_func->GetJITFunctionBody()->IsAsmJsMode())"
                             ,"ArgCount doesn\'t match StartCall count");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
      }
      if (pIStack_18->m_opcode != AsmJsCallI) {
        pIStack_88 = Lowerer::MakeCallInfoConst
                               (callInfoOpndRef_local._6_2_,(uint)argInstr,this->m_func);
        if (_argCount != (IntConstOpnd **)0x0) {
          IR::Opnd::Use(&pIStack_88->super_Opnd,this->m_func);
          *_argCount = pIStack_88;
        }
        pOVar7 = GetArgSlotOpnd(this,callInfoOpndRef_local._4_2_ + 1,(StackSym *)0x0,false);
        Lowerer::InsertMove(pOVar7,&pIStack_88->super_Opnd,pIStack_18,true);
      }
      argCountOpnd = (IntConstOpnd *)LowerStartCall(this,(Instr *)argCountOpnd);
      functionObjOpnd._4_4_ = (uint)argInstr + 1 + (uint)callInfoOpndRef_local._4_2_;
      puVar8 = max<unsigned_int>(&this->m_func->m_argSlotsForFunctionsCalled,
                                 (uint *)((long)&functionObjOpnd + 4));
      this->m_func->m_argSlotsForFunctionsCalled = *puVar8;
      pJVar6 = Func::GetJITFunctionBody(this->m_func);
      bVar2 = JITTimeFunctionBody::IsAsmJsMode(pJVar6);
      if (bVar2) {
        pOVar7 = IR::Instr::UnlinkSrc1(pIStack_18);
        callInstr_00 = pIStack_18;
        insertBeforeInstrForCFGCheck = IR::Instr::GetNextRealInstr((Instr *)src2);
        GeneratePreCall(this,callInstr_00,pOVar7,insertBeforeInstrForCFGCheck);
      }
      return functionObjOpnd._4_4_;
    }
    argLinkSym_1 = (StackSym *)IR::Opnd::AsSymOpnd(&argLinkOpnd_1->super_Opnd);
    pSStack_58 = Sym::AsStackSym(*(Sym **)&(argLinkSym_1->super_Sym).m_id);
    bVar2 = StackSym::IsArgSlotSym(pSStack_58);
    if ((!bVar2) || ((*(uint *)&pSStack_58->field_0x18 & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                         ,0x1d9,"(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef)",
                         "Arg tree not single def...");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    IR::Opnd::Free((Opnd *)argLinkSym_1,this->m_func);
    cfgInsertLoc = (pSStack_58->field_5).m_instrDef;
    argLinkOpnd_1 = (SymOpnd *)IR::Instr::UnlinkSrc2(cfgInsertLoc);
    LowererMD::ChangeToAssign(cfgInsertLoc);
    pOVar7 = IR::Instr::GetDst(cfgInsertLoc);
    pSVar5 = IR::Opnd::AsSymOpnd(pOVar7);
    this_00 = Sym::AsStackSym(pSVar5->m_sym);
    dstOpnd._6_2_ = StackSym::GetArgSlotNum(this_00);
    dstOpnd._4_2_ = dstOpnd._6_2_ + 1;
    if (dstOpnd._4_2_ < dstOpnd._6_2_) break;
    dstOpnd._4_2_ = dstOpnd._4_2_ + callInfoOpndRef_local._4_2_;
    if (dstOpnd._4_2_ < callInfoOpndRef_local._4_2_) {
      Js::Throw::OutOfMemory();
    }
    argLinkOpnd = (RegOpnd *)GetArgSlotOpnd(this,dstOpnd._4_2_,pSStack_58,false);
    IR::Instr::ReplaceDst(cfgInsertLoc,(Opnd *)argLinkOpnd);
    src2 = (Opnd *)IR::Instr::GetPrevRealInstr(cfgInsertLoc);
    *(uint *)&pSStack_58->field_0x18 = *(uint *)&pSStack_58->field_0x18 & 0xfffffff7;
    *(uint *)&pSStack_58->field_0x18 = *(uint *)&pSStack_58->field_0x18 & 0xffffffef;
    *(uint *)&pSStack_58->field_0x18 = *(uint *)&pSStack_58->field_0x18 & 0xffffffdf;
    IR::Instr::Unlink(cfgInsertLoc);
    IR::Instr::InsertBefore(pIStack_18,cfgInsertLoc);
    argInstr._0_4_ = (uint)argInstr + 1;
  }
  Js::Throw::OutOfMemory();
}

Assistant:

int32
LowererMDArch::LowerCallArgs(IR::Instr *callInstr, ushort callFlags, Js::ArgSlot extraParams, IR::IntConstOpnd **callInfoOpndRef /* = nullptr */)
{
    AssertMsg(this->helperCallArgsCount == 0, "We don't support nested helper calls yet");

    const Js::ArgSlot       argOffset       = 1;
    uint32                  argCount        = 0;

    // Lower args and look for StartCall

    IR::Instr * argInstr = callInstr;
    IR::Instr * cfgInsertLoc = callInstr->GetPrevRealInstr();
    IR::Opnd *src2 = argInstr->UnlinkSrc2();
    while (src2->IsSymOpnd())
    {
        IR::SymOpnd *   argLinkOpnd = src2->AsSymOpnd();
        StackSym *      argLinkSym  = argLinkOpnd->m_sym->AsStackSym();
        AssertMsg(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef, "Arg tree not single def...");
        argLinkOpnd->Free(this->m_func);

        argInstr = argLinkSym->m_instrDef;

        src2 = argInstr->UnlinkSrc2();
        this->lowererMD->ChangeToAssign(argInstr);

        // Mov each arg to its argSlot

        Js::ArgSlot     argPosition = argInstr->GetDst()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum();
        Js::ArgSlot     index       = argOffset + argPosition;
        if(index < argPosition)
        {
            Js::Throw::OutOfMemory();
        }
        index += extraParams;
        if(index < extraParams)
        {
            Js::Throw::OutOfMemory();
        }

        IR::Opnd *      dstOpnd     = this->GetArgSlotOpnd(index, argLinkSym);

        argInstr->ReplaceDst(dstOpnd);

        cfgInsertLoc = argInstr->GetPrevRealInstr();

        // The arg sym isn't assigned a constant directly anymore
        // TODO: We can just move the instruction down next to the call if it is just a constant assignment
        // but AMD64 doesn't have the MOV mem,imm64 encoding, and we have no code to detect if the value can fit
        // into imm32 and hoist the src if it is not.
        argLinkSym->m_isConst = false;
        argLinkSym->m_isIntConst = false;
        argLinkSym->m_isTaggableIntConst = false;

        argInstr->Unlink();
        callInstr->InsertBefore(argInstr);
        argCount++;
    }


    IR::RegOpnd *       argLinkOpnd = src2->AsRegOpnd();
    StackSym *          argLinkSym  = argLinkOpnd->m_sym->AsStackSym();
    AssertMsg(!argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef, "Arg tree not single def...");

    IR::Instr *startCallInstr = argLinkSym->m_instrDef;

    if (callInstr->m_opcode == Js::OpCode::NewScObject ||
        callInstr->m_opcode == Js::OpCode::NewScObjectSpread ||
        callInstr->m_opcode == Js::OpCode::NewScObjectLiteral ||
        callInstr->m_opcode == Js::OpCode::NewScObjArray ||
        callInstr->m_opcode == Js::OpCode::NewScObjArraySpread)
    {
        // These push an extra arg.
        argCount++;
    }

    AssertMsg(startCallInstr->m_opcode == Js::OpCode::StartCall ||
              startCallInstr->m_opcode == Js::OpCode::LoweredStartCall,
              "Problem with arg chain.");
    AssertMsg(startCallInstr->GetArgOutCount(/*getInterpreterArgOutCount*/ false) == argCount ||
              m_func->GetJITFunctionBody()->IsAsmJsMode(),
        "ArgCount doesn't match StartCall count");
    //
    // Machine dependent lowering
    //

    if (callInstr->m_opcode != Js::OpCode::AsmJsCallI)
    {
        // Push argCount
        IR::IntConstOpnd *argCountOpnd = Lowerer::MakeCallInfoConst(callFlags, argCount, m_func);
        if (callInfoOpndRef)
        {
            argCountOpnd->Use(m_func);
            *callInfoOpndRef = argCountOpnd;
        }
        Lowerer::InsertMove(this->GetArgSlotOpnd(1 + extraParams), argCountOpnd, callInstr);
    }
    startCallInstr = this->LowerStartCall(startCallInstr);

    const uint32 argSlots = argCount + 1 + extraParams; // + 1 for call flags
    this->m_func->m_argSlotsForFunctionsCalled = max(this->m_func->m_argSlotsForFunctionsCalled, argSlots);

    if (m_func->GetJITFunctionBody()->IsAsmJsMode())
    {
        IR::Opnd * functionObjOpnd = callInstr->UnlinkSrc1();
        GeneratePreCall(callInstr, functionObjOpnd, cfgInsertLoc->GetNextRealInstr());
    }

    return argSlots;
}